

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::FunctionalTest::prepareTestCases
          (FunctionalTest *this,GLenum dst_internal_format,GLenum dst_target,
          GLenum src_internal_format,GLenum src_target)

{
  GLuint GVar1;
  GLuint GVar2;
  bool bVar3;
  bool bVar4;
  GLenum GVar5;
  uint uVar6;
  GLenum GVar7;
  GLenum GVar8;
  uint uVar9;
  GLenum GVar10;
  uint uVar11;
  undefined1 local_d0 [8];
  testCase test_case;
  GLuint src_dim_diff;
  GLuint src_coord [3];
  GLuint n_dst_coords;
  GLuint dst_dim_diff;
  GLuint dst_coord [3];
  GLuint region_dimmension;
  GLuint reg_dim_id;
  GLuint dst_image_dimmension;
  GLuint dst_img_dim_id;
  GLuint src_image_dimmension;
  GLuint src_img_dim_id;
  GLuint dst_level;
  GLuint src_level;
  GLenum src_type;
  GLuint src_n_levels;
  GLenum src_format;
  GLenum dst_type;
  GLuint dst_n_levels;
  GLenum dst_format;
  bool is_src_multi_level;
  bool is_dst_multi_level;
  GLenum src_target_local;
  GLenum src_internal_format_local;
  GLenum dst_target_local;
  GLenum dst_internal_format_local;
  FunctionalTest *this_local;
  
  bVar3 = Utils::isTargetMultilevel(dst_target);
  bVar4 = Utils::isTargetMultilevel(src_target);
  GVar5 = Utils::getFormat(dst_internal_format);
  uVar6 = 1;
  if (bVar3) {
    uVar6 = 3;
  }
  GVar7 = Utils::getType(dst_internal_format);
  GVar8 = Utils::getFormat(src_internal_format);
  uVar9 = 1;
  if (bVar4) {
    uVar9 = 3;
  }
  GVar10 = Utils::getType(src_internal_format);
  for (src_img_dim_id = 0; src_img_dim_id < uVar9; src_img_dim_id = src_img_dim_id + 1) {
    for (src_image_dimmension = 0; src_image_dimmension < uVar6;
        src_image_dimmension = src_image_dimmension + 1) {
      for (dst_img_dim_id = 0; dst_img_dim_id < 2; dst_img_dim_id = dst_img_dim_id + 1) {
        GVar1 = prepareTestCases::image_dimmensions[dst_img_dim_id];
        for (reg_dim_id = 0; reg_dim_id < 2; reg_dim_id = reg_dim_id + 1) {
          GVar2 = prepareTestCases::image_dimmensions[reg_dim_id];
          for (dst_coord[2] = 0; dst_coord[2] < 2; dst_coord[2] = dst_coord[2] + 1) {
            dst_coord[1] = prepareTestCases::region_dimmensions[dst_coord[2]];
            memset(&n_dst_coords,0,0xc);
            uVar11 = GVar2 - dst_coord[1];
            src_coord[1] = 1;
            memset(&test_case.m_height,0,0xc);
            test_case.m_width = GVar1 - dst_coord[1];
            if (uVar11 == 1) {
              dst_dim_diff = 1;
              src_coord[1] = 2;
            }
            else if (1 < uVar11) {
              dst_dim_diff = uVar11 >> 1;
              dst_coord[0] = uVar11;
              src_coord[1] = 3;
            }
            test_case.m_dst.m_width = src_image_dimmension;
            test_case.m_src.m_width = src_img_dim_id;
            test_case.m_src_x = dst_coord[1];
            test_case.m_src_y = dst_coord[1];
            test_case.m_dst.m_format = (&n_dst_coords)[src_coord[1] - 1];
            test_case.m_dst.m_type = (&n_dst_coords)[src_coord[1] - 1];
            test_case.m_src.m_format = test_case.m_height;
            test_case.m_src.m_type = test_case.m_height;
            local_d0._0_4_ = dst_target;
            local_d0._4_4_ = GVar2;
            test_case.m_dst.m_target = GVar2;
            test_case.m_dst.m_height = dst_internal_format;
            test_case.m_dst.m_level = GVar5;
            test_case.m_dst.m_internal_format = GVar7;
            test_case.m_dst_x = src_target;
            test_case.m_dst_y = GVar1;
            test_case.m_src.m_target = GVar1;
            test_case.m_src.m_height = src_internal_format;
            test_case.m_src.m_level = GVar8;
            test_case.m_src.m_internal_format = GVar10;
            std::
            vector<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
            ::push_back(&this->m_test_cases,(value_type *)local_d0);
            if ((GVar2 == GVar1) && (GVar2 != 7)) {
              test_case.m_dst.m_format = 0;
              test_case.m_dst.m_type = 0;
              test_case.m_src.m_format = 0;
              test_case.m_src.m_type = 0;
              test_case.m_src_x = GVar2;
              test_case.m_src_y = GVar2;
              std::
              vector<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
              ::push_back(&this->m_test_cases,(value_type *)local_d0);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionalTest::prepareTestCases(GLenum dst_internal_format, GLenum dst_target, GLenum src_internal_format,
									  GLenum src_target)
{
	static const GLuint image_dimmensions[] = {
		7,
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_IMG_DIM
		8,
		9,
		10,
		11,
		12,
		13,
		14,
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_IMG_DIM */
		15
	};

	static const GLuint region_dimmensions[] = {
		1,
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_DIM
		2,
		3,
		4,
		5,
		6,
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_DIM */
		7
	};

	static const GLuint n_image_dimmensions  = sizeof(image_dimmensions) / sizeof(image_dimmensions[0]);
	static const GLuint n_region_dimmensions = sizeof(region_dimmensions) / sizeof(region_dimmensions[0]);

	const bool   is_dst_multi_level = Utils::isTargetMultilevel(dst_target);
	const bool   is_src_multi_level = Utils::isTargetMultilevel(src_target);
	const GLenum dst_format			= Utils::getFormat(dst_internal_format);
	const GLuint dst_n_levels		= (true == is_dst_multi_level) ? FUNCTIONAL_TEST_N_LEVELS : 1;
	const GLenum dst_type			= Utils::getType(dst_internal_format);
	const GLenum src_format			= Utils::getFormat(src_internal_format);
	const GLuint src_n_levels		= (true == is_src_multi_level) ? FUNCTIONAL_TEST_N_LEVELS : 1;
	const GLenum src_type			= Utils::getType(src_internal_format);

	for (GLuint src_level = 0; src_level < src_n_levels; ++src_level)
	{
		for (GLuint dst_level = 0; dst_level < dst_n_levels; ++dst_level)
		{
			for (GLuint src_img_dim_id = 0; src_img_dim_id < n_image_dimmensions; ++src_img_dim_id)
			{
				const GLuint src_image_dimmension = image_dimmensions[src_img_dim_id];

				for (GLuint dst_img_dim_id = 0; dst_img_dim_id < n_image_dimmensions; ++dst_img_dim_id)
				{
					const GLuint dst_image_dimmension = image_dimmensions[dst_img_dim_id];

					for (GLuint reg_dim_id = 0; reg_dim_id < n_region_dimmensions; ++reg_dim_id)
					{
						const GLuint region_dimmension = region_dimmensions[reg_dim_id];
						GLuint		 dst_coord[3]	  = { 0, 0, 0 };
						const GLuint dst_dim_diff	  = dst_image_dimmension - region_dimmension;
						GLuint		 n_dst_coords	  = 1;
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
						GLuint n_src_coords = 1;
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						GLuint		 src_coord[3] = { 0, 0, 0 };
						const GLuint src_dim_diff = src_image_dimmension - region_dimmension;

						/* Calculate coords */
						if (1 == dst_dim_diff)
						{
							dst_coord[1] = 1;
							n_dst_coords = 2;
						}
						else if (1 < dst_dim_diff)
						{
							dst_coord[1] = dst_dim_diff / 2;
							dst_coord[2] = dst_dim_diff;
							n_dst_coords = 3;
						}

						if (1 == src_dim_diff)
						{
							src_coord[1] = 1;
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
							n_src_coords = 2;
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						}
						else if (1 < src_dim_diff)
						{
							src_coord[1] = src_dim_diff / 2;
							src_coord[2] = src_dim_diff;
#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
							n_src_coords = 3;
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						}

						testCase test_case = {
							{									/* m_dst */
							  dst_target, dst_image_dimmension, /* width */
							  dst_image_dimmension,				/* height */
							  dst_level, dst_internal_format, dst_format, dst_type },
							0,									/* dst_x */
							0,									/* dst_y */
							{									/* m_src */
							  src_target, src_image_dimmension, /* width */
							  src_image_dimmension,				/* height */
							  src_level, src_internal_format, src_format, src_type },
							0,				   /* src_x */
							0,				   /* src_y */
							region_dimmension, /* width */
							region_dimmension, /* height */
						};

#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS
						for (GLuint src_x = 0; src_x < n_src_coords; ++src_x)
						{
							for (GLuint src_y = 0; src_y < n_src_coords; ++src_y)
							{
								for (GLuint dst_x = 0; dst_x < n_dst_coords; ++dst_x)
								{
									for (GLuint dst_y = 0; dst_y < n_dst_coords; ++dst_y)
									{
										test_case.m_dst_x = dst_coord[dst_x];
										test_case.m_dst_y = dst_coord[dst_y];
										test_case.m_src_x = src_coord[src_x];
										test_case.m_src_y = src_coord[src_y];

										m_test_cases.push_back(test_case);
									}
								}
							}
						}
#else  /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */
						test_case.m_dst_x = dst_coord[n_dst_coords - 1];
						test_case.m_dst_y = dst_coord[n_dst_coords - 1];
						test_case.m_src_x = src_coord[0];
						test_case.m_src_y = src_coord[0];

						m_test_cases.push_back(test_case);
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_REG_POS */

						/* Whole image, for non 7x7 */
						if ((dst_image_dimmension == src_image_dimmension) &&
							(image_dimmensions[0] != dst_image_dimmension))
						{
							test_case.m_dst_x  = 0;
							test_case.m_dst_y  = 0;
							test_case.m_src_x  = 0;
							test_case.m_src_y  = 0;
							test_case.m_width  = dst_image_dimmension;
							test_case.m_height = dst_image_dimmension;

							m_test_cases.push_back(test_case);
						}
					}
				}
			}
		}
	}
}